

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterFactory.cpp
# Opt level: O0

Reporters * ApprovalTests::ReporterFactory::createMap_abi_cxx11_(void)

{
  mapped_type *this;
  mapped_type *this_00;
  Reporters *in_RDI;
  Reporters *map;
  anon_class_1_0_00000001 *in_stack_fffffffffffff878;
  allocator *__f;
  function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>
  *in_stack_fffffffffffff880;
  key_type *in_stack_fffffffffffff898;
  key_type *__k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  *in_stack_fffffffffffff8a0;
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [39];
  undefined1 local_4f1 [40];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
         *)0x129f6f);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"AutoApproveIfMissingReporter",&local_31);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_68,"AutoApproveReporter",&local_69);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_68);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_90,"CIBuildOnlyReporter",&local_91);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_90);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_b8,"ClipboardReporter",&local_b9);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_b8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_e0,"DefaultFrontLoadedReporter",&local_e1);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_e0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_108,"DefaultReporter",&local_109);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_108);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_130,"DiffReporter",&local_131);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_130);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_158,"EnvironmentVariableReporter",&local_159);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_158);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_159);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_180,"QuietReporter",&local_181);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_180);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_1a8,"TextDiffReporter",&local_1a9);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_1a8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_1d0,"Linux::BeyondCompareReporter",&local_1d1);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_1d0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_1f8,"Linux::MeldReporter",&local_1f9);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_1f8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_220,"Linux::SublimeMergeReporter",&local_221);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_220);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_221);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_248,"Linux::KDiff3Reporter",&local_249);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_248);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_249);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_270,"Mac::AraxisMergeReporter",&local_271);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_270);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_271);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_298,"Mac::BeyondCompareReporter",&local_299);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_298);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_299);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_2c0,"Mac::DiffMergeReporter",&local_2c1);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_2c0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_2e8,"Mac::KaleidoscopeReporter",&local_2e9);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_2e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_310,"Mac::P4MergeReporter",&local_311);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_310);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_311);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_338,"Mac::SublimeMergeReporter",&local_339);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_338);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_339);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_360,"Mac::KDiff3Reporter",&local_361);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_360);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_361);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_388,"Mac::TkDiffReporter",&local_389);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_388);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_389);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_3b0,"Mac::VisualStudioCodeReporter",&local_3b1);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_3b0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_3d8,"Mac::CLionDiffReporter",&local_3d9);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_3d8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_400,"Windows::TortoiseDiffReporter",&local_401);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_400);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_401);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_428,"Windows::TortoiseGitDiffReporter",&local_429);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_428);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_429);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_450,"Windows::BeyondCompareReporter",&local_451);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_450);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_451);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_478,"Windows::WinMergeReporter",&local_479);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_478);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_479);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_4a0,"Windows::AraxisMergeReporter",&local_4a1);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_4a0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_4c8,"Windows::CodeCompareReporter",&local_4c9);
  this = ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
         ::operator[](in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_4c8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  __k = (key_type *)local_4f1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)(local_4f1 + 1),"Windows::SublimeMergeReporter",(allocator *)__k);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
                *)this,__k);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string((string *)(local_4f1 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_4f1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_518,"Windows::KDiff3Reporter",&local_519);
  this_00 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
                          *)this,__k);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(this_00,in_stack_fffffffffffff878);
  ::std::__cxx11::string::~string(local_518);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_519);
  __f = &local_541;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_540,"Windows::VisualStudioCodeReporter",__f);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
                *)this,__k);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(this_00,(anon_class_1_0_00000001 *)__f);
  ::std::__cxx11::string::~string(local_540);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_541);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_568,"CrossPlatform::VisualStudioCodeReporter",&local_569);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
                *)this,__k);
  ::std::
  function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>
  ::operator=(this_00,(anon_class_1_0_00000001 *)__f);
  ::std::__cxx11::string::~string(local_568);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_569);
  return in_RDI;
}

Assistant:

ReporterFactory::Reporters ReporterFactory::createMap()
    {
        Reporters map;

        APPROVAL_TESTS_REGISTER_REPORTER(AutoApproveIfMissingReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(AutoApproveReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(CIBuildOnlyReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(ClipboardReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(DefaultFrontLoadedReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(DefaultReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(DiffReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(EnvironmentVariableReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(QuietReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(TextDiffReporter);

        APPROVAL_TESTS_REGISTER_REPORTER(Linux::BeyondCompareReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Linux::MeldReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Linux::SublimeMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Linux::KDiff3Reporter);

        // begin-snippet: register_reporter_with_factory
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::AraxisMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::BeyondCompareReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::DiffMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::KaleidoscopeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::P4MergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::SublimeMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::KDiff3Reporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::TkDiffReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::VisualStudioCodeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Mac::CLionDiffReporter);
        // end-snippet

        APPROVAL_TESTS_REGISTER_REPORTER(Windows::TortoiseDiffReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::TortoiseGitDiffReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::BeyondCompareReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::WinMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::AraxisMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::CodeCompareReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::SublimeMergeReporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::KDiff3Reporter);
        APPROVAL_TESTS_REGISTER_REPORTER(Windows::VisualStudioCodeReporter);

        APPROVAL_TESTS_REGISTER_REPORTER(CrossPlatform::VisualStudioCodeReporter);

        return map;
    }